

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

int __thiscall
Lib::List<Inferences::ALASCA::SuperpositionConf::Lhs>::remove
          (List<Inferences::ALASCA::SuperpositionConf::Lhs> *this,char *__filename)

{
  bool bVar1;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *pLVar2;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *tl;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *next;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *current;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *result;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  SelectedEquality *in_stack_ffffffffffffff18;
  SelectedEquality *in_stack_ffffffffffffff20;
  SelectedEquality *l;
  SelectedEquality local_ac;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *local_78;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *local_70;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *local_68;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *local_18;
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *local_10;
  int local_8;
  
  local_18 = (List<Inferences::ALASCA::SuperpositionConf::Lhs> *)__filename;
  local_10 = this;
  bVar1 = isEmpty((List<Inferences::ALASCA::SuperpositionConf::Lhs> *)__filename);
  if (bVar1) {
    pLVar2 = empty();
    local_8 = (int)pLVar2;
  }
  else {
    head(in_stack_ffffffffffffff08);
    bVar1 = Kernel::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x4977fd);
    if (bVar1) {
      local_68 = tail(local_18);
      if (local_18 != (List<Inferences::ALASCA::SuperpositionConf::Lhs> *)0x0) {
        ~List((List<Inferences::ALASCA::SuperpositionConf::Lhs> *)0x497839);
        operator_delete(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
      }
      local_8 = (int)local_68;
    }
    else {
      pLVar2 = tail(local_18);
      bVar1 = isEmpty(pLVar2);
      if (bVar1) {
        local_8 = (int)local_18;
      }
      else {
        local_70 = local_18;
        local_78 = tail(local_18);
        do {
          l = &local_ac;
          head(in_stack_ffffffffffffff08);
          bVar1 = Kernel::operator==(l,in_stack_ffffffffffffff18);
          Inferences::ALASCA::SuperpositionConf::Lhs::~Lhs((Lhs *)0x49790e);
          if (bVar1) {
            pLVar2 = local_70;
            tl = tail(local_78);
            setTail(pLVar2,tl);
            if (local_78 != (List<Inferences::ALASCA::SuperpositionConf::Lhs> *)0x0) {
              ~List((List<Inferences::ALASCA::SuperpositionConf::Lhs> *)0x49795f);
              operator_delete(pLVar2,(size_t)in_stack_ffffffffffffff08);
            }
            local_8 = (int)local_18;
            return local_8;
          }
          local_70 = local_78;
          local_78 = tail(local_78);
          bVar1 = isEmpty(local_78);
        } while (!bVar1);
        local_8 = (int)local_18;
      }
    }
  }
  return local_8;
}

Assistant:

static List* remove (C elem, List* l)
  {
    if (isEmpty(l)) return empty();

    if (l->head() == elem) {
      List* result = l->tail();
      delete l;
      return result;
    }
    if (isEmpty(l->tail())) return l;

    List* current = l;
    List* next = l->tail();

    for (;;) {
      if (next->head() == elem) { // element found
        current->setTail(next->tail());
        delete next;
        return l;
      }
      current = next;
      next = next->tail();
      if (isEmpty(next)) return l;
    }
  }